

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

int __thiscall XMISong::FindXMIDforms(XMISong *this,BYTE *chunk,int len,TrackInfo *songs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  XMISong *this_00;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  while (iVar4 <= len + -0xc) {
    this_00 = (XMISong *)((long)(chunk + iVar4) + 4);
    iVar2 = *(int *)(chunk + iVar4);
    uVar1 = GetBigInt((uchar *)this_00);
    if (iVar2 == 0x20544143) {
      iVar2 = FindXMIDforms(this,chunk + (long)iVar4 + 0xc,uVar1 - 4,songs + iVar3);
      iVar3 = iVar3 + iVar2;
    }
    else if ((iVar2 == 0x4d524f46) && (*(int *)(chunk + (long)iVar4 + 8) == 0x44494d58)) {
      if (songs != (TrackInfo *)0x0) {
        FoundXMID(this_00,chunk + (long)iVar4 + 0xc,uVar1 - 4,songs + iVar3);
      }
      iVar3 = iVar3 + 1;
    }
    iVar4 = iVar4 + uVar1 + (uVar1 & 1) + 8;
    if ((int)uVar1 < 0) {
      iVar4 = len;
    }
  }
  return iVar3;
}

Assistant:

int XMISong::FindXMIDforms(const BYTE *chunk, int len, TrackInfo *songs) const
{
	int count = 0;

	for (int p = 0; p <= len - 12; )
	{
		int chunktype = GetNativeInt(chunk + p);
		int chunklen = GetBigInt(chunk + p + 4);

		if (chunktype == MAKE_ID('F','O','R','M'))
		{
			if (GetNativeInt(chunk + p + 8) == MAKE_ID('X','M','I','D'))
			{
				if (songs != NULL)
				{
					FoundXMID(chunk + p + 12, chunklen - 4, songs + count);
				}
				count++;
			}
		}
		else if (chunktype == MAKE_ID('C','A','T',' '))
		{
			// Recurse to handle CAT chunks.
			count += FindXMIDforms(chunk + p + 12, chunklen - 4, songs + count);
		}
		// IFF chunks are padded to even byte boundaries to avoid
		// unaligned reads on 68k processors.
		p += 8 + chunklen + (chunklen & 1);
		// Avoid crashes from corrupt chunks which indicate a negative size.
		if (chunklen < 0) p = len;
	}
	return count;
}